

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBufferTestUtil.cpp
# Opt level: O2

void __thiscall deqp::gles2::Functional::BufferTestUtil::BufferCase::deinit(BufferCase *this)

{
  _Base_ptr p_Var1;
  _Self __tmp;
  
  for (p_Var1 = (this->m_allocatedBuffers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->m_allocatedBuffers)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    glu::CallLogWrapper::glDeleteBuffers(&this->super_CallLogWrapper,1,&p_Var1[1]._M_color);
  }
  return;
}

Assistant:

void BufferCase::deinit (void)
{
	for (set<deUint32>::const_iterator bufIter = m_allocatedBuffers.begin(); bufIter != m_allocatedBuffers.end(); bufIter++)
		glDeleteBuffers(1, &(*bufIter));
}